

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.h
# Opt level: O2

cmCommand * __thiscall cmTargetSourcesCommand::Clone(cmTargetSourcesCommand *this)

{
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0x58);
  cmTargetSourcesCommand((cmTargetSourcesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmTargetSourcesCommand; }